

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.cpp
# Opt level: O2

void __thiscall mjs::print_visitor::operator()(print_visitor *this,call_expression *e)

{
  char *pcVar1;
  size_t i;
  ulong uVar2;
  
  accept<mjs::print_visitor>
            ((e->member_)._M_t.
             super___uniq_ptr_impl<mjs::expression,_std::default_delete<mjs::expression>_>._M_t.
             super__Tuple_impl<0UL,_mjs::expression_*,_std::default_delete<mjs::expression>_>.
             super__Head_base<0UL,_mjs::expression_*,_false>._M_head_impl,this);
  std::operator<<(this->os_,'(');
  for (uVar2 = 0;
      uVar2 < (ulong)((long)(e->arguments_).
                            super__Vector_base<std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>,_std::allocator<std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(e->arguments_).
                            super__Vector_base<std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>,_std::allocator<std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 3); uVar2 = uVar2 + 1) {
    pcVar1 = "], ";
    if (uVar2 == 0) {
      pcVar1 = "\t";
    }
    std::operator<<(this->os_,pcVar1 + 1);
    accept<mjs::print_visitor>
              ((expression *)
               (e->arguments_).
               super__Vector_base<std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>,_std::allocator<std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar2]._M_t.
               super___uniq_ptr_impl<mjs::expression,_std::default_delete<mjs::expression>_>._M_t,
               this);
  }
  std::operator<<(this->os_,')');
  return;
}

Assistant:

void operator()(const call_expression& e) {
        accept(e.member(), *this);
        os_ << '(';
        const auto& args = e.arguments();
        for (size_t i = 0; i < args.size(); ++i) {
            os_ << (i ? ", " : "");
            accept(*args[i], *this);
        }
        os_ << ')';
    }